

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphFileOperations.hpp
# Opt level: O2

string * floorplan::GraphFileOperations::formatStringForDot
                   (string *__return_storage_ptr__,string *str)

{
  long lVar1;
  string illegalChars;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (str->_M_string_length != 0) {
    if ((int)*(str->_M_dataplus)._M_p - 0x30U < 10) {
      std::operator+(&local_38,"S",str);
      std::__cxx11::string::operator=((string *)str,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"-* ",&local_39);
    while( true ) {
      lVar1 = std::__cxx11::string::find_first_of((string *)str,(ulong)&local_38);
      if (lVar1 == -1) break;
      (str->_M_dataplus)._M_p[lVar1] = '_';
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

static string formatStringForDot(string str){
        if (str.size() != 0){
            if (isdigit(str[0]))
                str = "S" + str;

            string illegalChars = "-* ";
            size_t found=str.find_first_of(illegalChars);
            while (found!=string::npos)
            {
                str[found]='_';
                found=str.find_first_of(illegalChars,found+1);
            }
        }
        return str;

    }